

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.cpp
# Opt level: O0

Rule * __thiscall EOPlus::Context::GetGoal(Context *this)

{
  bool bVar1;
  const_reference pvVar2;
  Context *this_local;
  
  if ((this->state != (State *)0x0) &&
     (bVar1 = std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::empty(&this->state->rules),
     !bVar1)) {
    pvVar2 = std::deque<EOPlus::Rule,_std::allocator<EOPlus::Rule>_>::operator[]
                       (&this->state->rules,this->state->goal_rule);
    return pvVar2;
  }
  return (Rule *)0x0;
}

Assistant:

const Rule* Context::GetGoal() const
	{
		if (!this->state || this->state->rules.empty())
			return 0;

		return &this->state->rules[this->state->goal_rule];
	}